

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5SegiterPoslist(Fts5Index *p,Fts5SegIter *pSeg,Fts5Colset *pColset,Fts5Buffer *pBuf)

{
  int local_5c;
  Fts5Buffer *local_58;
  PoslistOffsetsCtx sCtx_1;
  PoslistCallbackCtx sCtx;
  Fts5Buffer *pBuf_local;
  Fts5Colset *pColset_local;
  Fts5SegIter *pSeg_local;
  Fts5Index *p_local;
  
  if ((uint)pBuf->nSpace < (uint)(pBuf->n + pSeg->nPos + 8)) {
    local_5c = sqlite3Fts5BufferSize(&p->rc,pBuf,pSeg->nPos + 8 + pBuf->n);
  }
  else {
    local_5c = 0;
  }
  if (local_5c == 0) {
    memset(pBuf->p + (pBuf->n + pSeg->nPos),0,8);
    if (pColset == (Fts5Colset *)0x0) {
      fts5ChunkIterate(p,pSeg,pBuf,fts5PoslistCallback);
    }
    else if (p->pConfig->eDetail == 0) {
      sCtx_1._16_8_ = pBuf;
      fts5IndexColsetTest(pColset,0);
      fts5ChunkIterate(p,pSeg,&sCtx_1.iRead,fts5PoslistFilterCallback);
    }
    else {
      memset(&local_58,0,0x18);
      local_58 = pBuf;
      sCtx_1.pBuf = (Fts5Buffer *)pColset;
      fts5ChunkIterate(p,pSeg,&local_58,fts5PoslistOffsetsCallback);
    }
  }
  return;
}

Assistant:

static void fts5SegiterPoslist(
  Fts5Index *p,
  Fts5SegIter *pSeg,
  Fts5Colset *pColset,
  Fts5Buffer *pBuf
){
  if( 0==fts5BufferGrow(&p->rc, pBuf, pSeg->nPos+FTS5_DATA_ZERO_PADDING) ){
    memset(&pBuf->p[pBuf->n+pSeg->nPos], 0, FTS5_DATA_ZERO_PADDING);
    if( pColset==0 ){
      fts5ChunkIterate(p, pSeg, (void*)pBuf, fts5PoslistCallback);
    }else{
      if( p->pConfig->eDetail==FTS5_DETAIL_FULL ){
        PoslistCallbackCtx sCtx;
        sCtx.pBuf = pBuf;
        sCtx.pColset = pColset;
        sCtx.eState = fts5IndexColsetTest(pColset, 0);
        assert( sCtx.eState==0 || sCtx.eState==1 );
        fts5ChunkIterate(p, pSeg, (void*)&sCtx, fts5PoslistFilterCallback);
      }else{
        PoslistOffsetsCtx sCtx;
        memset(&sCtx, 0, sizeof(sCtx));
        sCtx.pBuf = pBuf;
        sCtx.pColset = pColset;
        fts5ChunkIterate(p, pSeg, (void*)&sCtx, fts5PoslistOffsetsCallback);
      }
    }
  }
}